

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords(Dictionary *this,int32_t i)

{
  uint __line;
  char *__assertion;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x60;
  }
  else {
    if (i < this->nwords_) {
      return &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
              _M_impl.super__Vector_impl_data._M_start[(uint)i].subwords;
    }
    __assertion = "i < nwords_";
    __line = 0x61;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/dictionary.cc"
                ,__line,
                "const std::vector<int32_t> &fasttext::Dictionary::getSubwords(int32_t) const");
}

Assistant:

const std::vector<int32_t>& Dictionary::getSubwords(int32_t i) const {
	assert(i >= 0);
	assert(i < nwords_);
	return words_[i].subwords;
}